

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O2

llama_adapter_lora * llama_adapter_lora_init(llama_model *model,char *path_lora)

{
  _Base_ptr __rhs;
  ggml_backend_buffer_type *pgVar1;
  bool bVar2;
  llm_arch lVar3;
  uint uVar4;
  int iVar5;
  llama_adapter_lora *this;
  ggml_tensor *pgVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  code *pcVar11;
  ggml_backend_buffer_type **__args;
  ggml_backend_buffer_type *pgVar12;
  iterator iVar13;
  long lVar14;
  mapped_type pgVar15;
  mapped_type *ppgVar16;
  ggml_tensor *pgVar17;
  mapped_type *pmVar18;
  _Base_ptr p_Var19;
  runtime_error *prVar20;
  pointer ppgVar21;
  string *suffix;
  string *suffix_00;
  string *suffix_01;
  string *suffix_02;
  anon_class_8_1_de840007 aVar22;
  float fVar23;
  undefined1 auVar24 [16];
  allocator<char> local_151;
  anon_class_8_1_de840007 get_kv_str;
  string adapter_type;
  string local_120;
  gguf_context_ptr ctx_gguf;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  *__range1;
  ggml_context_ptr ctx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
  ab_map;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> buft_extra;
  __node_base *local_78;
  map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
  ctx_map;
  ggml_context *ctx_init;
  
  this = (llama_adapter_lora *)operator_new(0x70);
  *(undefined8 *)&(this->ab_map)._M_h._M_rehash_policy = 0;
  (this->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->alpha = 0;
  (this->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ab_map)._M_h._M_buckets = &(this->ab_map)._M_h._M_single_bucket;
  (this->ab_map)._M_h._M_bucket_count = 1;
  (this->ab_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ab_map)._M_h._M_element_count = 0;
  (this->ab_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loading lora adapter from \'%s\' ...\n",
                     "llama_adapter_lora_init_impl",path_lora);
  ctx_gguf._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
  super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
  super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<gguf_context,_gguf_context_deleter,_true,_true>)
       gguf_init_from_file(path_lora,1,&ctx_init);
  if ((tuple<gguf_context_*,_gguf_context_deleter>)
      ctx_gguf._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
      super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
      super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl ==
      (_Head_base<0UL,_gguf_context_*,_false>)0x0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ab_map,path_lora,(allocator<char> *)&adapter_type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ctx_map,
                   "failed to load lora adapter file from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab_map);
    std::runtime_error::runtime_error(prVar20,(string *)&ctx_map);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
  super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)
       (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)ctx_init;
  get_kv_str.ctx_gguf = &ctx_gguf;
  LLM_KV::LLM_KV((LLM_KV *)&buft_extra,LLM_ARCH_UNKNOWN,(char *)0x0);
  LLM_KV::operator()[abi_cxx11_((string *)&ab_map,(LLM_KV *)&buft_extra,LLM_KV_GENERAL_TYPE);
  llama_adapter_lora_init_impl::anon_class_8_1_de840007::operator()
            ((string *)&ctx_map,&get_kv_str,(string *)&ab_map);
  std::__cxx11::string::~string((string *)&ab_map);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &ctx_map,"adapter");
  if (bVar2) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ab_map,
                   "expect general.type to be \'adapter\', but got: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ctx_map);
    std::runtime_error::runtime_error(prVar20,(string *)&ab_map);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&adapter_type,(LLM_KV *)&buft_extra,LLM_KV_GENERAL_ARCHITECTURE);
  llama_adapter_lora_init_impl::anon_class_8_1_de840007::operator()
            ((string *)&ab_map,&get_kv_str,&adapter_type);
  std::__cxx11::string::~string((string *)&adapter_type);
  lVar3 = llm_arch_from_string((string *)&ab_map);
  if (lVar3 != model->arch) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"model arch and LoRA arch mismatch");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_120,(LLM_KV *)&buft_extra,LLM_KV_ADAPTER_TYPE);
  llama_adapter_lora_init_impl::anon_class_8_1_de840007::operator()
            (&adapter_type,&get_kv_str,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  bVar2 = std::operator!=(&adapter_type,"lora");
  if (bVar2) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"expect adapter.type to be \'lora\', but got: ",&adapter_type);
    std::runtime_error::runtime_error(prVar20,(string *)&local_120);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  LLM_KV::operator()[abi_cxx11_(&local_120,(LLM_KV *)&buft_extra,LLM_KV_ADAPTER_LORA_ALPHA);
  uVar4 = gguf_find_key(ctx_gguf._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
                        .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                        super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                        local_120._M_dataplus._M_p);
  fVar23 = 0.0;
  if (-1 < (int)uVar4) {
    fVar23 = (float)gguf_get_val_f32(ctx_gguf._M_t.
                                     super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                     super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                     super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                     uVar4 & 0x7fffffff);
  }
  this->alpha = fVar23;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&adapter_type);
  std::__cxx11::string::~string((string *)&ab_map);
  std::__cxx11::string::~string((string *)&ctx_map);
  iVar5 = gguf_get_n_tensors(ctx_gguf._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>
                             ._M_t.super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                             super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl);
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ctx_map._M_t._M_impl.super__Rb_tree_header._M_header;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ab_map._M_t._M_impl.super__Rb_tree_header._M_header;
  ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ab_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pgVar6 = (ggml_tensor *)
           ggml_get_first_tensor
                     (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
  local_78 = &(this->ab_map)._M_h._M_before_begin;
  for (; pgVar6 != (ggml_tensor *)0x0;
      pgVar6 = (ggml_tensor *)
               ggml_get_next_tensor
                         (ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,pgVar6)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&adapter_type,pgVar6->name,(allocator<char> *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,".lora_a",(allocator<char> *)&buft_extra);
    bVar2 = llama_adapter_lora_init_impl::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&adapter_type,&local_120,suffix);
    std::__cxx11::string::~string((string *)&local_120);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,".lora_a",(allocator<char> *)&get_kv_str);
      std::__cxx11::string::string<std::allocator<char>>((string *)&buft_extra,"",&local_151);
      replace_all(&adapter_type,&local_120,(string *)&buft_extra);
      std::__cxx11::string::~string((string *)&buft_extra);
      std::__cxx11::string::~string((string *)&local_120);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
              ::find(&ab_map._M_t,&adapter_type);
      if ((_Rb_tree_header *)iVar7._M_node == &ab_map._M_t._M_impl.super__Rb_tree_header) {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                 ::operator[](&ab_map,&adapter_type);
        pmVar8->a = pgVar6;
        pmVar8->b = (ggml_tensor *)0x0;
      }
      else {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                 ::operator[](&ab_map,&adapter_type);
        pmVar8->a = pgVar6;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,".lora_b",(allocator<char> *)&buft_extra);
      bVar2 = llama_adapter_lora_init_impl::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&adapter_type,&local_120,suffix_00);
      std::__cxx11::string::~string((string *)&local_120);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,".lora_b",(allocator<char> *)&get_kv_str);
        std::__cxx11::string::string<std::allocator<char>>((string *)&buft_extra,"",&local_151);
        replace_all(&adapter_type,&local_120,(string *)&buft_extra);
        std::__cxx11::string::~string((string *)&buft_extra);
        std::__cxx11::string::~string((string *)&local_120);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                ::find(&ab_map._M_t,&adapter_type);
        if ((_Rb_tree_header *)iVar7._M_node == &ab_map._M_t._M_impl.super__Rb_tree_header) {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                   ::operator[](&ab_map,&adapter_type);
          pmVar8->a = (ggml_tensor *)0x0;
        }
        else {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                   ::operator[](&ab_map,&adapter_type);
        }
        pmVar8->b = pgVar6;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"_norm.weight",(allocator<char> *)&buft_extra);
        bVar2 = llama_adapter_lora_init_impl::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&adapter_type,&local_120,suffix_01);
        std::__cxx11::string::~string((string *)&local_120);
        if (!bVar2) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buft_extra,"LoRA tensor \'",&adapter_type);
          std::operator+(&local_120,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buft_extra,"\' has unexpected suffix");
          std::runtime_error::runtime_error(prVar20,(string *)&local_120);
          __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    std::__cxx11::string::~string((string *)&adapter_type);
  }
  buft_extra.
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buft_extra.
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buft_extra.
  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = ggml_backend_dev_by_type(0);
  uVar10 = ggml_backend_dev_backend_reg(uVar9);
  pcVar11 = (code *)ggml_backend_reg_get_proc_address(uVar10,"ggml_backend_dev_get_extra_bufts");
  if (pcVar11 != (code *)0x0) {
    __args = (ggml_backend_buffer_type **)(*pcVar11)(uVar9);
    for (; (__args != (ggml_backend_buffer_type **)0x0 &&
           (*__args != (ggml_backend_buffer_type *)0x0)); __args = __args + 1) {
      std::vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>>::
      emplace_back<ggml_backend_buffer_type*&>
                ((vector<ggml_backend_buffer_type*,std::allocator<ggml_backend_buffer_type*>> *)
                 &buft_extra,__args);
    }
  }
  p_Var19 = ab_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var19 == &ab_map._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
      ::reserve(&this->ctxs,ctx_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
      ::reserve(&this->bufs,ctx_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      p_Var19 = ctx_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var19 == &ctx_map._M_t._M_impl.super__Rb_tree_header) {
          llama_file::llama_file((llama_file *)&get_kv_str,path_lora,"rb");
          adapter_type._M_dataplus._M_p = (pointer)0x0;
          adapter_type._M_string_length = 0;
          adapter_type.field_2._M_allocated_capacity = 0;
          local_120._M_dataplus._M_p = (pointer)&ctx_gguf;
          local_120._M_string_length = (size_type)&adapter_type;
          local_120.field_2._M_allocated_capacity = (size_type)&get_kv_str;
          while (local_78 = local_78->_M_nxt, local_78 != (__node_base *)0x0) {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
                     ::operator[](&ab_map,(key_type *)(local_78 + 1));
            pgVar6 = pmVar8->b;
            pgVar17 = (ggml_tensor *)local_78[6]._M_nxt;
            llama_adapter_lora_init_impl::anon_class_24_3_38fa6930::operator()
                      ((anon_class_24_3_38fa6930 *)&local_120,pmVar8->a,
                       (ggml_tensor *)local_78[5]._M_nxt);
            llama_adapter_lora_init_impl::anon_class_24_3_38fa6930::operator()
                      ((anon_class_24_3_38fa6930 *)&local_120,pgVar6,pgVar17);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adapter_type);
          llama_file::~llama_file((llama_file *)&get_kv_str);
          llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: loaded %zu tensors from lora file\n",
                             "llama_adapter_lora_init_impl",(this->ab_map)._M_h._M_element_count * 2
                            );
          std::_Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
          ::~_Vector_base(&buft_extra.
                           super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                         );
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>_>
          ::~_Rb_tree(&ab_map._M_t);
          std::
          _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
          ::~_Rb_tree(&ctx_map._M_t);
          std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx);
          std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(&ctx_gguf);
          return this;
        }
        adapter_type._M_dataplus._M_p =
             (pointer)ggml_backend_alloc_ctx_tensors_from_buft
                                (p_Var19[1]._M_parent,*(undefined8 *)(p_Var19 + 1));
        if (adapter_type._M_dataplus._M_p == (pointer)0x0) break;
        uVar9 = ggml_backend_buffer_name(adapter_type._M_dataplus._M_p);
        uVar10 = ggml_backend_buffer_get_size(adapter_type._M_dataplus._M_p);
        auVar24._8_4_ = (int)((ulong)uVar10 >> 0x20);
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = 0x45300000;
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s LoRA buffer size = %8.2f MiB\n",
                           SUB84(((auVar24._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) *
                                 0.0009765625 * 0.0009765625,0),"llama_adapter_lora_init_impl",uVar9
                          );
        std::
        vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
        ::emplace_back<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>
                  ((vector<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>,std::allocator<std::unique_ptr<ggml_backend_buffer,ggml_backend_buffer_deleter>>>
                    *)&this->bufs,
                   (unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&adapter_type);
        std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
                  ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&adapter_type);
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
      }
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar20,"failed to allocate buffer for lora adapter\n");
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&adapter_type,"token_embd.weight",(allocator<char> *)&local_120);
    __rhs = p_Var19 + 1;
    bVar2 = llama_adapter_lora_init_impl::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)__rhs,&adapter_type,suffix_02);
    std::__cxx11::string::~string((string *)&adapter_type);
    if ((*(long *)(p_Var19 + 2) == 0) || (p_Var19[2]._M_parent == (_Base_ptr)0x0)) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_120,"LoRA tensor pair for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&adapter_type,&local_120,"\' is missing one component");
      std::runtime_error::runtime_error(prVar20,(string *)&adapter_type);
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar6 = llama_model::get_tensor(model,*(char **)__rhs);
    if (pgVar6 == (ggml_tensor *)0x0) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_120,"LoRA tensor \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(&adapter_type,&local_120,
                     "\' does not exist in base model (hint: maybe wrong base model?)");
      std::runtime_error::runtime_error(prVar20,(string *)&adapter_type);
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar12 = (ggml_backend_buffer_type *)ggml_backend_buffer_get_type(pgVar6->buffer);
    ppgVar21 = buft_extra.
               super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppgVar21 ==
          buft_extra.
          super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001c7881;
      pgVar1 = *ppgVar21;
      ppgVar21 = ppgVar21 + 1;
    } while (pgVar1 != pgVar12);
    uVar9 = ggml_backend_buft_name(pgVar12);
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: lora for \'%s\' cannot use buft \'%s\', fallback to CPU\n",
                       "llama_adapter_lora_init_impl",pgVar6->name,uVar9);
    uVar9 = ggml_backend_dev_by_type(0);
    pgVar12 = (ggml_backend_buffer_type *)ggml_backend_dev_buffer_type(uVar9);
LAB_001c7881:
    uVar9 = ggml_backend_buft_name(pgVar12);
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: lora for \'%s\' -> \'%s\'\n",
                       "llama_adapter_lora_init_impl",pgVar6->name,uVar9);
    local_120._M_dataplus._M_p = (pointer)pgVar12;
    iVar13 = std::
             _Rb_tree<ggml_backend_buffer_type_*,_std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>,_std::_Select1st<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
             ::find(&ctx_map._M_t,(key_type *)&local_120);
    if ((_Rb_tree_header *)iVar13._M_node == &ctx_map._M_t._M_impl.super__Rb_tree_header) {
      lVar14 = ggml_tensor_overhead();
      adapter_type._M_dataplus._M_p = (pointer)(lVar14 * iVar5);
      adapter_type._M_string_length = 0;
      adapter_type.field_2._M_local_buf[0] = 1;
      pgVar15 = (mapped_type)ggml_init();
      get_kv_str.ctx_gguf = (gguf_context_ptr *)pgVar15;
      if (pgVar15 == (mapped_type)0x0) {
        aVar22.ctx_gguf = (gguf_context_ptr *)0x0;
      }
      else {
        ppgVar16 = std::
                   map<ggml_backend_buffer_type_*,_ggml_context_*,_std::less<ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_buffer_type_*const,_ggml_context_*>_>_>
                   ::operator[](&ctx_map,(key_type *)&local_120);
        *ppgVar16 = pgVar15;
        std::
        vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
        ::emplace_back<ggml_context*&>
                  ((vector<std::unique_ptr<ggml_context,ggml_context_deleter>,std::allocator<std::unique_ptr<ggml_context,ggml_context_deleter>>>
                    *)&this->ctxs,(ggml_context **)&get_kv_str);
        aVar22 = get_kv_str;
      }
    }
    else {
      aVar22.ctx_gguf = (gguf_context_ptr *)iVar13._M_node[1]._M_parent;
    }
    if (bVar2) {
      if (((_Base_ptr)pgVar6->ne[0] != (p_Var19[2]._M_parent)->_M_right) ||
         (pgVar6->ne[1] != *(long *)(*(long *)(p_Var19 + 2) + 0x18))) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_120,"tensor \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+(&adapter_type,&local_120,
                       "\' has incorrect shape (hint: maybe wrong base model?)");
        std::runtime_error::runtime_error(prVar20,(string *)&adapter_type);
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      if (((_Base_ptr)pgVar6->ne[0] != *(_Base_ptr *)(*(long *)(p_Var19 + 2) + 0x10)) ||
         ((_Base_ptr)pgVar6->ne[1] != (p_Var19[2]._M_parent)->_M_right)) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_120,"tensor \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        std::operator+(&adapter_type,&local_120,
                       "\' has incorrect shape (hint: maybe wrong base model?)");
        std::runtime_error::runtime_error(prVar20,(string *)&adapter_type);
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(_Base_ptr *)(*(long *)(p_Var19 + 2) + 0x18) != (p_Var19[2]._M_parent)->_M_left) {
        prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar20,
                   "lora_a tensor is not transposed (hint: adapter from \"finetune\" example is no longer supported)"
                  );
        __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pgVar6 = (ggml_tensor *)ggml_dup_tensor(aVar22.ctx_gguf);
    pgVar17 = (ggml_tensor *)ggml_dup_tensor(aVar22.ctx_gguf,p_Var19[2]._M_parent);
    ggml_set_name(pgVar6,*(long *)(p_Var19 + 2) + 0x100);
    ggml_set_name(pgVar17,p_Var19[2]._M_parent + 8);
    pmVar18 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_adapter_lora_weight>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,(key_type *)__rhs);
    pmVar18->a = pgVar6;
    pmVar18->b = pgVar17;
    p_Var19 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var19);
  } while( true );
}

Assistant:

llama_adapter_lora * llama_adapter_lora_init(llama_model * model, const char * path_lora) {
    llama_adapter_lora * adapter = new llama_adapter_lora();

    try {
        llama_adapter_lora_init_impl(*model, path_lora, *adapter);
        return adapter;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to apply lora adapter: %s\n", __func__, err.what());

        delete adapter;
    }

    return nullptr;
}